

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test4::generateUniformValues(GPUShaderFP64Test4 *this)

{
  int iVar1;
  double *double_ptr;
  uint n_double_ptr;
  uint n_double_ptrs;
  double *double_ptrs [72];
  _stage_data *stage_ptr;
  uint n_stage;
  uint n_stages;
  _stage_data *stages [6];
  GPUShaderFP64Test4 *this_local;
  
  _n_stage = &this->m_data_cs;
  stages[0] = &this->m_data_fs;
  stages[1] = &this->m_data_gs;
  stages[2] = &this->m_data_tc;
  stages[3] = &this->m_data_te;
  stages[4] = &this->m_data_vs;
  for (stage_ptr._0_4_ = 0; (uint)stage_ptr < 6; stage_ptr._0_4_ = (uint)stage_ptr + 1) {
    _n_double_ptr = *(long *)(&n_stage + (ulong)(uint)stage_ptr * 2);
    double_ptrs[0] = (double *)(_n_double_ptr + 8);
    double_ptrs[1] = (double *)(_n_double_ptr + 0x10);
    double_ptrs[2] = (double *)(_n_double_ptr + 0x18);
    double_ptrs[3] = (double *)(_n_double_ptr + 0x20);
    double_ptrs[4] = (double *)(_n_double_ptr + 0x28);
    double_ptrs[5] = (double *)(_n_double_ptr + 0x30);
    double_ptrs[6] = (double *)(_n_double_ptr + 0x48);
    double_ptrs[7] = (double *)(_n_double_ptr + 0x50);
    double_ptrs[8] = (double *)(_n_double_ptr + 0x58);
    double_ptrs[9] = (double *)(_n_double_ptr + 0x60);
    double_ptrs[10] = (double *)(_n_double_ptr + 0x68);
    double_ptrs[0xb] = (double *)(_n_double_ptr + 0x70);
    double_ptrs[0xc] = (double *)(_n_double_ptr + 0x90);
    double_ptrs[0xd] = (double *)(_n_double_ptr + 0x98);
    double_ptrs[0xe] = (double *)(_n_double_ptr + 0xa0);
    double_ptrs[0xf] = (double *)(_n_double_ptr + 0xa8);
    double_ptrs[0x10] = (double *)(_n_double_ptr + 0xb0);
    double_ptrs[0x11] = (double *)(_n_double_ptr + 0xb8);
    double_ptrs[0x12] = (double *)(_n_double_ptr + 0xc0);
    double_ptrs[0x13] = (double *)(_n_double_ptr + 200);
    double_ptrs[0x14] = (double *)(_n_double_ptr + 0x120);
    double_ptrs[0x15] = (double *)(_n_double_ptr + 0x128);
    double_ptrs[0x16] = (double *)(_n_double_ptr + 0x130);
    double_ptrs[0x17] = (double *)(_n_double_ptr + 0x138);
    double_ptrs[0x18] = (double *)(_n_double_ptr + 0x140);
    double_ptrs[0x19] = (double *)(_n_double_ptr + 0x148);
    double_ptrs[0x1a] = (double *)(_n_double_ptr + 0x150);
    double_ptrs[0x1b] = (double *)(_n_double_ptr + 0x168);
    double_ptrs[0x1c] = (double *)(_n_double_ptr + 0x170);
    double_ptrs[0x1d] = (double *)(_n_double_ptr + 0x178);
    double_ptrs[0x1e] = (double *)(_n_double_ptr + 0x180);
    double_ptrs[0x1f] = (double *)(_n_double_ptr + 0x188);
    double_ptrs[0x20] = (double *)(_n_double_ptr + 400);
    double_ptrs[0x21] = (double *)(_n_double_ptr + 0x1b0);
    double_ptrs[0x22] = (double *)(_n_double_ptr + 0x1b8);
    double_ptrs[0x23] = (double *)(_n_double_ptr + 0x1c0);
    double_ptrs[0x24] = (double *)(_n_double_ptr + 0x1c8);
    double_ptrs[0x25] = (double *)(_n_double_ptr + 0x1d0);
    double_ptrs[0x26] = (double *)(_n_double_ptr + 0x1d8);
    double_ptrs[0x27] = (double *)(_n_double_ptr + 0x1e0);
    double_ptrs[0x28] = (double *)(_n_double_ptr + 0x1e8);
    double_ptrs[0x29] = (double *)(_n_double_ptr + 0x240);
    double_ptrs[0x2a] = (double *)(_n_double_ptr + 0x248);
    double_ptrs[0x2b] = (double *)(_n_double_ptr + 0x250);
    double_ptrs[0x2c] = (double *)(_n_double_ptr + 600);
    double_ptrs[0x2d] = (double *)(_n_double_ptr + 0x260);
    double_ptrs[0x2e] = (double *)(_n_double_ptr + 0x268);
    double_ptrs[0x2f] = (double *)(_n_double_ptr + 0x270);
    double_ptrs[0x30] = (double *)(_n_double_ptr + 0x278);
    double_ptrs[0x31] = (double *)(_n_double_ptr + 0x280);
    double_ptrs[0x32] = (double *)(_n_double_ptr + 0x288);
    double_ptrs[0x33] = (double *)(_n_double_ptr + 0x290);
    double_ptrs[0x34] = (double *)(_n_double_ptr + 0x298);
    double_ptrs[0x35] = (double *)(_n_double_ptr + 0x2a0);
    double_ptrs[0x36] = (double *)(_n_double_ptr + 0x2a8);
    double_ptrs[0x37] = (double *)(_n_double_ptr + 0x2b0);
    double_ptrs[0x38] = (double *)(_n_double_ptr + 0x2b8);
    double_ptrs[0x39] = (double *)(_n_double_ptr + 0x2c0);
    double_ptrs[0x3a] = (double *)(_n_double_ptr + 0x2c8);
    double_ptrs[0x3b] = (double *)(_n_double_ptr + 0x2d0);
    double_ptrs[0x3c] = (double *)(_n_double_ptr + 0x2d8);
    double_ptrs[0x3d] = (double *)(_n_double_ptr + 0x2e0);
    double_ptrs[0x3e] = (double *)(_n_double_ptr + 0x2e8);
    double_ptrs[0x3f] = (double *)(_n_double_ptr + 0x2f0);
    double_ptrs[0x40] = (double *)(_n_double_ptr + 0x2f8);
    double_ptrs[0x41] = (double *)(_n_double_ptr + 0x300);
    double_ptrs[0x42] = (double *)(_n_double_ptr + 0x308);
    double_ptrs[0x43] = (double *)(_n_double_ptr + 0x310);
    double_ptrs[0x44] = (double *)(_n_double_ptr + 0x318);
    double_ptrs[0x45] = (double *)(_n_double_ptr + 800);
    double_ptrs[0x46] = (double *)(_n_double_ptr + 0x328);
    for (double_ptr._0_4_ = 0; (uint)double_ptr < 0x48; double_ptr._0_4_ = (uint)double_ptr + 1) {
      iVar1 = -1;
      if (generateUniformValues::seed % 2 == 0) {
        iVar1 = 1;
      }
      **(double **)(&n_double_ptr + (ulong)(uint)double_ptr * 2) =
           ((double)(generateUniformValues::seed % 0x6c4) / 125.7) * (double)iVar1;
      generateUniformValues::seed = generateUniformValues::seed + 0x2ef;
    }
  }
  return;
}

Assistant:

void GPUShaderFP64Test4::generateUniformValues()
{
	_stage_data*	   stages[] = { &m_data_cs, &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		_stage_data* stage_ptr = stages[n_stage];

		/* Iterate through all uniform components and assign them double values */
		double* double_ptrs[] = {
			&stage_ptr->uniform_structure_arrays[0].uniform_double,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 7,
			&stage_ptr->uniform_structure_arrays[1].uniform_double,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 7,
			&stage_ptr->uniforms.uniform_double,
			stage_ptr->uniforms.uniform_double_arr + 0,
			stage_ptr->uniforms.uniform_double_arr + 1,
			stage_ptr->uniforms.uniform_dvec2 + 0,
			stage_ptr->uniforms.uniform_dvec2 + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 0,
			stage_ptr->uniforms.uniform_dvec2_arr + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 2,
			stage_ptr->uniforms.uniform_dvec2_arr + 3,
			stage_ptr->uniforms.uniform_dvec3 + 0,
			stage_ptr->uniforms.uniform_dvec3 + 1,
			stage_ptr->uniforms.uniform_dvec3 + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 0,
			stage_ptr->uniforms.uniform_dvec3_arr + 1,
			stage_ptr->uniforms.uniform_dvec3_arr + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 3,
			stage_ptr->uniforms.uniform_dvec3_arr + 4,
			stage_ptr->uniforms.uniform_dvec3_arr + 5,
			stage_ptr->uniforms.uniform_dvec4 + 0,
			stage_ptr->uniforms.uniform_dvec4 + 1,
			stage_ptr->uniforms.uniform_dvec4 + 2,
			stage_ptr->uniforms.uniform_dvec4 + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 0,
			stage_ptr->uniforms.uniform_dvec4_arr + 1,
			stage_ptr->uniforms.uniform_dvec4_arr + 2,
			stage_ptr->uniforms.uniform_dvec4_arr + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 4,
			stage_ptr->uniforms.uniform_dvec4_arr + 5,
			stage_ptr->uniforms.uniform_dvec4_arr + 6,
			stage_ptr->uniforms.uniform_dvec4_arr + 7,
		};
		const unsigned int n_double_ptrs = sizeof(double_ptrs) / sizeof(double_ptrs[0]);

		for (unsigned int n_double_ptr = 0; n_double_ptr < n_double_ptrs; ++n_double_ptr)
		{
			double* double_ptr = double_ptrs[n_double_ptr];

			/* Generate the value. Use magic numbers to generate a set of double-precision
			 * floating-point numbers.
			 */
			static int seed = 16762362;

			*double_ptr = ((double)(seed % 1732)) / 125.7 * (((seed % 2) == 0) ? 1 : -1);

			seed += 751;
		} /* for (all pointers to double variables) */
	}	 /* for (all stages) */
}